

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Decode
          (LE_DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (6 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8DeadRecknoningAlgorithm);
    (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_LinearAcceleration,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_DeadReckoningParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LE_DEAD_RECKONING_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8DeadRecknoningAlgorithm
           >> KDIS_STREAM m_LinearAcceleration
           >> KDIS_STREAM m_AngularVelocity;
}